

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O3

void __thiscall blc::tools::VFile::refresh(VFile *this)

{
  fstream *pfVar1;
  VFile *pVVar2;
  char cVar3;
  istream *piVar4;
  long *plVar5;
  exception *this_00;
  long *plVar6;
  long lVar7;
  string completFile;
  string ligne;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  VFile *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar7 = *(long *)(*(long *)&this->_file + -0x18);
  if (((&this->field_0x28)[lVar7] & 5) == 0) {
    pfVar1 = &this->_file;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_b8 = this;
    while( true ) {
      cVar3 = std::ios::widen((char)lVar7 + (char)pfVar1);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)pfVar1,(string *)&local_90,cVar3);
      pVVar2 = local_b8;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_70,&local_d8,&local_90);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar5[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar6;
        local_b0 = (long *)*plVar5;
      }
      local_a8 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b0);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      lVar7 = *(long *)(*(long *)pfVar1 + -0x18);
    }
    if (local_d8._M_string_length != 0) {
      local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] = '\0';
      local_d8._M_string_length = local_d8._M_string_length - 1;
    }
    std::__cxx11::string::_M_assign((string *)&local_b8->_cache);
    pVVar2->_isClosed = false;
    pVVar2->_cursor = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x78);
  std::operator+(&local_50,"Impossible to open file ",&this->_fileName);
  error::exception::exception(this_00,&local_50);
  __cxa_throw(this_00,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::tools::VFile::refresh() {
	if (this->_file) {
		std::string ligne;
		std::string completFile;
		while(getline(this->_file, ligne)) {
			completFile = completFile + ligne + "\n";
		}
		if (completFile.size() > 0)
			completFile.erase(completFile.size()-1);
		this->_cache = completFile;
		this->open();
		this->_cursor = 0;
	} else {
		throw blc::error::exception("Impossible to open file " + this->_fileName);
	}
}